

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

double __thiscall QPDFObjectHandle::getNumericValue(QPDFObjectHandle *this)

{
  bool bVar1;
  longlong lVar2;
  char *__nptr;
  allocator<char> local_59;
  string local_58;
  string local_38;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *this_local;
  
  local_18 = this;
  bVar1 = isInteger(this);
  if (bVar1) {
    lVar2 = getIntValue(this);
    this_local = (QPDFObjectHandle *)(double)lVar2;
  }
  else {
    bVar1 = isReal(this);
    if (bVar1) {
      getRealValue_abi_cxx11_(&local_38,this);
      __nptr = (char *)std::__cxx11::string::c_str();
      this_local = (QPDFObjectHandle *)atof(__nptr);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"returning 0",&local_59);
      typeWarning(this,"number",&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      QTC::TC("qpdf","QPDFObjectHandle numeric non-numeric",0);
      this_local = (QPDFObjectHandle *)0x0;
    }
  }
  return (double)this_local;
}

Assistant:

double
QPDFObjectHandle::getNumericValue() const
{
    if (isInteger()) {
        return static_cast<double>(getIntValue());
    } else if (isReal()) {
        return atof(getRealValue().c_str());
    } else {
        typeWarning("number", "returning 0");
        QTC::TC("qpdf", "QPDFObjectHandle numeric non-numeric");
        return 0;
    }
}